

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O2

int __thiscall soul::Compiler::link(Compiler *this,char *__from,char *__to)

{
  bool bVar1;
  Namespace *pNVar2;
  Module *pMVar3;
  BuildSettings *in_RCX;
  Compiler *this_00;
  ProcessorBase *in_R8;
  double __x;
  CodeLocation CStackY_1b8;
  string_view in_stack_fffffffffffffe58;
  CompileMessageHandler handler;
  _Any_data local_160;
  code *local_150;
  code *local_148;
  ScopedTimer timer___LINE__;
  string local_118;
  BuildSettings local_f8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"link time",(allocator<char> *)&handler);
  ScopedTimer::ScopedTimer(&timer___LINE__,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  CompileMessageHandler::CompileMessageHandler(&handler,(CompileMessageList *)__to);
  this_00 = (Compiler *)(__from + 0x60);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*((pool_ptr<soul::AST::Namespace> *)this_00);
  ASTUtilities::resolveHoistedEndpoints((Allocator *)__from,&pNVar2->super_ModuleBase);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*((pool_ptr<soul::AST::Namespace> *)this_00);
  ASTUtilities::mergeDuplicateNamespaces(pNVar2);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*((pool_ptr<soul::AST::Namespace> *)this_00);
  ASTUtilities::removeModulesWithSpecialisationParams(pNVar2);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*((pool_ptr<soul::AST::Namespace> *)this_00);
  ResolutionPass::run((Allocator *)__from,&pNVar2->super_ModuleBase,false);
  getSystemModule(in_stack_fffffffffffffe58);
  compile((Compiler *)__from,&CStackY_1b8);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&CStackY_1b8.sourceCode);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*((pool_ptr<soul::AST::Namespace> *)this_00);
  ConvertComplexPass::run((Allocator *)__from,pNVar2);
  ASTUtilities::connectAnyChildEndpointsNeedingToBeExposed((Allocator *)__from,in_R8);
  Program::Program((Program *)this);
  StringDictionary::operator=
            ((StringDictionary *)
             ((long)(this->allocator).pool.pools.
                    super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x278),
             (StringDictionary *)(__from + 0x38));
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*((pool_ptr<soul::AST::Namespace> *)this_00);
  compileAllModules(this_00,pNVar2,(Program *)this,in_R8);
  heart::Utilities::inlineFunctionsThatUseAdvanceOrStreams<soul::Optimisations>((Program *)this);
  BuildSettings::BuildSettings(&local_f8,in_RCX);
  heart::Checker::sanityCheck((Program *)this,&local_f8);
  BuildSettings::~BuildSettings(&local_f8);
  if (in_RCX->optimisationLevel != 0) {
    Optimisations::removeUnusedObjects((Program *)this);
  }
  reset((Compiler *)__from);
  bVar1 = Logger::isLoggingEnabled();
  if (bVar1) {
    pMVar3 = Program::getMainProcessor((Program *)this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe58,&pMVar3->originalFullName,": linked HEART");
    local_160._8_8_ = 0;
    local_148 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_Compiler.cpp:271:9)>
                ::_M_invoke;
    local_150 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_Compiler.cpp:271:9)>
                ::_M_manager;
    local_160._M_unused._M_object = this;
    Logger::log((Logger *)&stack0xfffffffffffffe58,__x);
    std::_Function_base::~_Function_base((_Function_base *)&local_160);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
  }
  heart::Checker::testHEARTRoundTrip((Program *)this);
  Optimisations::optimiseFunctionBlocks((Program *)this);
  Optimisations::removeUnusedVariables((Program *)this);
  CompileMessageHandler::~CompileMessageHandler(&handler);
  ScopedTimer::~ScopedTimer(&timer___LINE__);
  return (int)this;
}

Assistant:

Program Compiler::link (CompileMessageList& messageList, const BuildSettings& settings, AST::ProcessorBase& processorToRun)
{
    try
    {
        SOUL_LOG_TIME_OF_SCOPE ("link time");
        CompileMessageHandler handler (messageList);
        ASTUtilities::resolveHoistedEndpoints (allocator, *topLevelNamespace);
        ASTUtilities::mergeDuplicateNamespaces (*topLevelNamespace);
        ASTUtilities::removeModulesWithSpecialisationParams (*topLevelNamespace);
        ResolutionPass::run (allocator, *topLevelNamespace, false);

        compile (getSystemModule ("soul.complex"));
        ConvertComplexPass::run (allocator, *topLevelNamespace);

        ASTUtilities::connectAnyChildEndpointsNeedingToBeExposed (allocator, processorToRun);

        Program program;
        program.getStringDictionary() = allocator.stringDictionary;  // Bring the existing string dictionary along so that the handles match
        compileAllModules (*topLevelNamespace, program, processorToRun);
        heart::Utilities::inlineFunctionsThatUseAdvanceOrStreams<Optimisations> (program);
        heart::Checker::sanityCheck (program, settings);

        if (settings.optimisationLevel != 0)
        {
            Optimisations::removeUnusedObjects (program);
        }

        reset();

        SOUL_LOG (program.getMainProcessor().originalFullName + ": linked HEART",
                  [&] { return program.toHEART(); });

        heart::Checker::testHEARTRoundTrip (program);
        Optimisations::optimiseFunctionBlocks (program);
        Optimisations::removeUnusedVariables (program);

        return program;
    }
    catch (AbortCompilationException) {}

    return {};
}